

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O0

void musl_getopt_msg(char *a,char *b,char *c,size_t l)

{
  FILE *__s;
  int iVar1;
  size_t sVar2;
  FILE *f;
  size_t l_local;
  char *c_local;
  char *b_local;
  char *a_local;
  
  __s = _stderr;
  iVar1 = fputs(a,_stderr);
  if (-1 < iVar1) {
    sVar2 = strlen(b);
    sVar2 = fwrite(b,sVar2,1,__s);
    if (sVar2 != 0) {
      sVar2 = fwrite(c,1,l,__s);
      if (sVar2 == l) {
        putc(10,__s);
      }
    }
  }
  return;
}

Assistant:

static void musl_getopt_msg(char const *a, char const *b, char const *c, size_t l)
{
	FILE *f = stderr;

	if (fputs(a, f) >= 0 &&
	    fwrite(b, strlen(b), 1, f) &&
	    fwrite(c, 1, l, f) == l)
		putc('\n', f);
}